

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# driver.hpp
# Opt level: O2

void make_timelapse(vector<cv::Mat,_std::allocator<cv::Mat>_> *image_list,arguments *args)

{
  char cVar1;
  undefined4 uVar2;
  ostream *poVar3;
  ulong uVar4;
  undefined8 extraout_RAX;
  ulong uVar5;
  undefined8 in_R9;
  long lVar6;
  int total_frames;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 local_60;
  VideoWriter outputVideo;
  
  poVar3 = std::operator<<((ostream *)&std::cout,(string *)color::blue_abi_cxx11_);
  poVar3 = std::operator<<(poVar3," Timelapse in progress ");
  poVar3 = std::operator<<(poVar3,(string *)color::reset_abi_cxx11_);
  std::endl<char,std::char_traits<char>>(poVar3);
  uVar2 = cv::VideoWriter::fourcc('H','2','6','4');
  uVar7 = **(undefined8 **)
            ((image_list->super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start + 0x40);
  uVar8 = 0;
  cv::VideoWriter::VideoWriter(&outputVideo);
  local_60 = CONCAT44((int)uVar7,(int)((ulong)uVar7 >> 0x20));
  cv::VideoWriter::open
            ((double)args->frames,&outputVideo,&args->output_file_name,uVar2,&local_60,1,in_R9,uVar7
             ,uVar8);
  cVar1 = cv::VideoWriter::isOpened();
  if (cVar1 != '\0') {
    uVar4 = ((long)(image_list->super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
            (long)(image_list->super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start) / 0x60;
    lVar6 = 0;
    total_frames = (int)uVar4;
    uVar5 = 0;
    if (0 < total_frames) {
      uVar5 = uVar4 & 0xffffffff;
    }
    for (uVar4 = 0; uVar5 != uVar4; uVar4 = uVar4 + 1) {
      cv::VideoWriter::operator<<
                (&outputVideo,
                 (image_list->super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start + lVar6);
      progress_bar((int)uVar4,total_frames);
      lVar6 = lVar6 + 0x60;
    }
    cv::VideoWriter::~VideoWriter(&outputVideo);
    return;
  }
  poVar3 = std::operator<<((ostream *)&std::cout,(string *)color::red_abi_cxx11_);
  poVar3 = std::operator<<(poVar3,"Could not open the output video for write ");
  poVar3 = std::operator<<(poVar3,(string *)color::reset_abi_cxx11_);
  std::endl<char,std::char_traits<char>>(poVar3);
  _Exit(0);
  cv::VideoWriter::~VideoWriter(&outputVideo);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void make_timelapse(vector<cv::Mat> image_list, arguments args)
{
    cout<< color::blue << " Timelapse in progress "<<color::reset<<endl;
    int codec = VideoWriter::fourcc('H', '2', '6', '4');
    int h = 0, w = 0;
    Size S = image_list[0].size();
    VideoWriter outputVideo;
    outputVideo.open(args.output_file_name, codec, args.frames, S, true);

    if (!outputVideo.isOpened())
    {
        std::cout<< color::red << "Could not open the output video for write " << color::reset << std::endl;
        _Exit(0);
    }

    // frames to video
    int total = image_list.size();
    for (int i = 0; i < total; i++)
    {
        outputVideo << image_list[i];
        progress_bar(i, total);
    }
}